

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::CollectNodes
          (ColladaLoader *this,aiNode *pNode,
          vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *poNodes)

{
  size_t a;
  ulong uVar1;
  aiNode *local_20;
  
  local_20 = pNode;
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::push_back(poNodes,&local_20);
  for (uVar1 = 0; uVar1 < local_20->mNumChildren; uVar1 = uVar1 + 1) {
    CollectNodes(this,local_20->mChildren[uVar1],poNodes);
  }
  return;
}

Assistant:

void ColladaLoader::CollectNodes(const aiNode* pNode, std::vector<const aiNode*>& poNodes) const
{
    poNodes.push_back(pNode);
    for (size_t a = 0; a < pNode->mNumChildren; ++a) {
        CollectNodes(pNode->mChildren[a], poNodes);
    }
}